

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.hpp
# Opt level: O0

void __thiscall
cs::compiler_type::process_line
          (compiler_type *this,deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *line)

{
  reference pptVar1;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *in_RSI;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *in_stack_00000118;
  compiler_type *in_stack_00000120;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *in_stack_000004a8;
  compiler_type *in_stack_000004b0;
  size_t in_stack_00000630;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *in_stack_00000638;
  compiler_type *in_stack_00000640;
  
  process_brackets(in_stack_000004b0,in_stack_000004a8);
  pptVar1 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::back(in_RSI);
  token_base::get_line_num(*pptVar1);
  kill_brackets(in_stack_00000640,in_stack_00000638,in_stack_00000630);
  kill_expr(in_stack_00000120,in_stack_00000118);
  return;
}

Assistant:

void process_line(std::deque<token_base *> &line)
		{
			process_brackets(line);
			kill_brackets(line, static_cast<token_endline *>(line.back())->get_line_num());
			kill_expr(line);
		}